

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.hpp
# Opt level: O2

void __thiscall peach::fsm::NameFinder::NameFinder(NameFinder *this)

{
  element_type *this_00;
  shared_ptr<peach::fsm::Node> firstNode;
  __shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  std::__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
  Node::
  addTransitionToNewNode<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>>
            ((Node *)&firstNode,(tokenCategory_t)local_38._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  this_00 = firstNode.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&firstNode.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>);
  Node::
  addTransition<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>>
            (this_00,(shared_ptr<peach::fsm::Node> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  Node::
  addTransitionToNewNode<peach::transition::TransitionNegation<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>>>
            ((Node *)&stack0xffffffffffffffd8,
             (tokenCategory_t)
             firstNode.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&firstNode.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

NameFinder()
    {
        auto firstNode = getRoot()->addTransitionToNewNode<transition::LatinUnderscoreTransition>(token::tokenCategory::UNDEFINED);
        firstNode->addTransition<transition::LatinUnderscoreDigitTransition>(firstNode);
        firstNode->addTransitionToNewNode<transition::TransitionNegation<transition::LatinUnderscoreDigitTransition>>(token::tokenCategory::NAME);
    }